

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

Vec_Ptr_t * Cof_ManCollectHighFanout(Cof_Man_t *p,int nNodes)

{
  Cof_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < nNodes - 1U) {
    iVar2 = nNodes;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar2;
  if (iVar2 == 0) {
    ppvVar1 = (void **)0x0;
  }
  else {
    ppvVar1 = (void **)malloc((long)iVar2 << 3);
  }
  vNodes->pArray = ppvVar1;
  iVar2 = p->nObjData;
  if (0 < iVar2) {
    uVar4 = 0;
    do {
      if (p->pObjData == (int *)0x0) {
        return vNodes;
      }
      pNode = (Cof_Obj_t *)(p->pObjData + uVar4);
      uVar3 = *(uint *)pNode;
      if (((uVar3 & 0xf1) == 1) || ((uVar3 & 0xf0) != 0 && (uVar3 & 1) == 0)) {
        Cof_ManInsertEntry_rec(vNodes,pNode,nNodes);
        uVar3 = *(uint *)pNode;
        iVar2 = p->nObjData;
      }
      uVar3 = (int)uVar4 + (uVar3 >> 8) + (uVar3 >> 4 & 0xf) + 6;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < iVar2);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Cof_ManCollectHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( nNodes );
    Cof_ManForEachObj( p, pObj, i )
        if ( Cof_ObjIsCi(pObj) || Cof_ObjIsNode(pObj) )
            Cof_ManInsertEntry_rec( vNodes, pObj, nNodes );
    return vNodes;
}